

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 VmJsonTokenize(SyStream *pStream,SyToken *pToken,void *pUserData,void *pCtxData)

{
  byte bVar1;
  byte *pbVar2;
  long lVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  sxu32 sVar10;
  byte *pbVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  
  pbVar8 = pStream->zText;
  pbVar2 = pStream->zEnd;
  if (pbVar2 <= pbVar8) {
    return -0x12;
  }
  lVar15 = 0;
  while( true ) {
    bVar1 = pbVar8[lVar15];
    if ((0xbf < (ulong)bVar1) ||
       (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 0x20) == 0))
    break;
    if (bVar1 == 10) {
      pStream->nLine = pStream->nLine + 1;
    }
    lVar3 = lVar15 + 1;
    pStream->zText = pbVar8 + lVar3;
    lVar15 = lVar15 + 1;
    if (pbVar8 + lVar3 == pbVar2) {
      return -0x12;
    }
  }
  sVar10 = pStream->nLine;
  pToken->nLine = sVar10;
  pToken->pUserData = (void *)0x0;
  pbVar11 = pbVar8 + lVar15;
  (pToken->sData).zString = (char *)pbVar11;
  (pToken->sData).nByte = 0;
  bVar1 = pbVar8[lVar15];
  uVar13 = (ulong)bVar1;
  iVar14 = (int)lVar15;
  uVar12 = (uint)pbVar8;
  pbVar9 = pbVar11;
  if (0xbf < uVar13) goto LAB_0012c21d;
  ppuVar5 = __ctype_b_loc();
  if ((uVar13 == 0x5f) || (((*ppuVar5)[uVar13] & 0x400) != 0)) {
    pbVar8 = pbVar8 + lVar15 + 1;
    do {
      pbVar9 = pbVar8;
      pStream->zText = pbVar9;
LAB_0012c21d:
      pbVar6 = pbVar9;
      if (0xbf < *pbVar9) {
        pbVar6 = pbVar9 + 1;
      }
      pbVar8 = pbVar6;
      if (pbVar6 < pbVar2) {
        lVar15 = (long)pbVar2 - (long)pbVar6;
        do {
          uVar13 = (ulong)*pbVar6;
          pbVar8 = pbVar6;
          if ((0xbf < uVar13) ||
             ((ppuVar5 = __ctype_b_loc(), uVar13 != 0x5f && (((*ppuVar5)[uVar13] & 8) == 0))))
          break;
          pbVar6 = pbVar6 + 1;
          lVar15 = lVar15 + -1;
          pbVar8 = pbVar2;
        } while (lVar15 != 0);
      }
      if (pbVar8 == pbVar9) {
        uVar7 = ((int)pbVar9 - uVar12) - iVar14;
        (pToken->sData).nByte = uVar7;
        pToken->nType = 0x800;
        if ((((int)pbVar9 - uVar12) - iVar14 == 4) &&
           (sVar4 = SyStrnicmp((char *)pbVar11,"true",4), sVar4 == 0)) {
          pToken->nType = 1;
          return 0;
        }
        if (uVar7 == 4) {
          sVar4 = SyStrnicmp((char *)pbVar11,"null",4);
          if (sVar4 == 0) {
            pToken->nType = 8;
            return 0;
          }
          return 0;
        }
        if (uVar7 == 5) {
          sVar4 = SyStrnicmp((char *)pbVar11,"false",5);
          if (sVar4 == 0) {
            pToken->nType = 2;
            return 0;
          }
          return 0;
        }
        return 0;
      }
    } while( true );
  }
  if (bVar1 < 0x5b) {
    if (bVar1 == 0x22) {
      pbVar8 = pbVar8 + lVar15 + 1;
      pStream->zText = pbVar8;
      (pToken->sData).zString = (char *)pbVar8;
      if (pbVar8 < pbVar2) {
        uVar7 = 1;
        do {
          if (*pbVar8 == 10) {
            sVar10 = sVar10 + 1;
            pStream->nLine = sVar10;
          }
          else if ((*pbVar8 == 0x22) && (pbVar8[-1] != 0x5c)) {
            pToken->nType = 4;
            pStream->zText = pbVar8 + 1;
            goto LAB_0012c1ee;
          }
          pbVar8 = pbVar8 + 1;
          pStream->zText = pbVar8;
          uVar7 = uVar7 + 1;
        } while (pbVar8 < pbVar2);
      }
      pToken->nType = 0x1000;
      *(undefined4 *)pUserData = 0xfffffff4;
      uVar7 = (~uVar12 + (int)pbVar8) - iVar14;
      sVar10 = pToken->nType;
      (pToken->sData).nByte = uVar7;
      if (sVar10 != 4) {
        return 0;
      }
LAB_0012c1ee:
      (pToken->sData).nByte = uVar7 - 1;
      return 0;
    }
    if (bVar1 == 0x2c) {
      sVar10 = 0x400;
    }
    else {
      if (bVar1 != 0x3a) goto LAB_0012bfe0;
      sVar10 = 0x200;
    }
  }
  else if (bVar1 < 0x7b) {
    sVar10 = 0x80;
    if (bVar1 != 0x5b) {
      if (bVar1 != 0x5d) {
LAB_0012bfe0:
        if (((((*ppuVar5)[uVar13] >> 0xb & 1) == 0) && (uVar13 != 0x2d)) && (bVar1 != 0x2b)) {
          pToken->nType = 0x1000;
          pStream->zText = pbVar8 + lVar15 + 1;
          *(undefined4 *)pUserData = 0xfffffff4;
          return -10;
        }
        pbVar8 = pbVar8 + lVar15 + 1;
        pStream->zText = pbVar8;
        pToken->nType = 0x10;
        while (pbVar11 = pbVar8, pbVar8 < pbVar2) {
          bVar1 = *pbVar8;
          if (0xbf < (ulong)bVar1) {
LAB_0012c16a:
            if ((bVar1 & 0xdf) == 0x45) {
              pbVar9 = pbVar8 + 1;
              pStream->zText = pbVar9;
              pbVar11 = pbVar9;
              if (pbVar9 < pbVar2) {
                if ((*pbVar9 == 0x2b) || (*pbVar9 == 0x2d)) {
                  pbVar9 = pbVar8 + 2;
                  pStream->zText = pbVar9;
                }
                pbVar11 = pbVar9;
                if (pbVar9 < pbVar2) {
                  lVar15 = (long)pbVar2 - (long)pbVar9;
                  goto LAB_0012c1ae;
                }
              }
            }
            break;
          }
          if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 8) == 0) {
            if (bVar1 != 0x2e) goto LAB_0012c16a;
            goto LAB_0012c0be;
          }
          pbVar8 = pbVar8 + 1;
          pStream->zText = pbVar8;
        }
        goto LAB_0012c06c;
      }
      sVar10 = 0x100;
    }
  }
  else if (bVar1 == 0x7d) {
    sVar10 = 0x40;
  }
  else {
    if (bVar1 != 0x7b) goto LAB_0012bfe0;
    sVar10 = 0x20;
  }
  pToken->nType = sVar10;
  pStream->zText = pbVar8 + lVar15 + 1;
  pbVar11 = pbVar8 + lVar15 + 1;
  goto LAB_0012c06c;
  while( true ) {
    pbVar9 = pbVar9 + 1;
    pStream->zText = pbVar9;
    lVar15 = lVar15 + -1;
    pbVar11 = pbVar2;
    if (lVar15 == 0) break;
LAB_0012c1ae:
    pbVar11 = pbVar9;
    if ((0xbf < (ulong)*pbVar9) || ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar9 * 2 + 1) & 8) == 0))
    break;
  }
  goto LAB_0012c06c;
  while( true ) {
    bVar1 = *pbVar11;
    if ((0xbf < (ulong)bVar1) ||
       (pbVar8 = pbVar11, (*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 8) == 0)) break;
LAB_0012c0be:
    pbVar9 = pbVar8;
    pbVar11 = pbVar9 + 1;
    pStream->zText = pbVar11;
    if (pbVar2 <= pbVar11) goto LAB_0012c06c;
  }
  if ((bVar1 & 0xdf) == 0x45) {
    pbVar8 = pbVar9 + 2;
    pStream->zText = pbVar8;
    pbVar11 = pbVar8;
    if (pbVar8 < pbVar2) {
      if ((*pbVar8 == 0x2b) || (*pbVar8 == 0x2d)) {
        pbVar8 = pbVar9 + 3;
        pStream->zText = pbVar8;
      }
      pbVar11 = pbVar8;
      if (pbVar8 < pbVar2) {
        lVar15 = (long)pbVar2 - (long)pbVar8;
        do {
          pbVar11 = pbVar8;
          if ((0xbf < (ulong)*pbVar8) ||
             ((*(byte *)((long)*ppuVar5 + (ulong)*pbVar8 * 2 + 1) & 8) == 0)) break;
          pbVar8 = pbVar8 + 1;
          pStream->zText = pbVar8;
          lVar15 = lVar15 + -1;
          pbVar11 = pbVar2;
        } while (lVar15 != 0);
      }
    }
  }
LAB_0012c06c:
  (pToken->sData).nByte = ((int)pbVar11 - uVar12) - iVar14;
  return 0;
}

Assistant:

static sxi32 VmJsonTokenize(SyStream *pStream, SyToken *pToken, void *pUserData, void *pCtxData)
{
	int *pJsonErr = (int *)pUserData;
	SyString *pStr;
	int c;
	/* Ignore leading white spaces */
	while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisSpace(pStream->zText[0]) ){
		/* Advance the stream cursor */
		if( pStream->zText[0] == '\n' ){
			/* Update line counter */
			pStream->nLine++;
		}
		pStream->zText++;
	}
	if( pStream->zText >= pStream->zEnd ){
		/* End of input reached */
		SXUNUSED(pCtxData); /* cc warning */
		return SXERR_EOF;
	}
	/* Record token starting position and line */
	pToken->nLine = pStream->nLine;
	pToken->pUserData = 0;
	pStr = &pToken->sData;
	SyStringInitFromBuf(pStr, pStream->zText, 0);
	if( pStream->zText[0] >= 0xc0 || SyisAlpha(pStream->zText[0]) || pStream->zText[0] == '_' ){
		/* The following code fragment is taken verbatim from the xPP source tree.
		 * xPP is a modern embeddable macro processor with advanced features useful for
		 * application seeking for a production quality, ready to use macro processor.
		 * xPP is a widely used library developed and maintened by Symisc Systems.
		 * You can reach the xPP home page by following this link:
		 * http://xpp.symisc.net/
		 */
		const unsigned char *zIn;
		/* Isolate UTF-8 or alphanumeric stream */
		if( pStream->zText[0] < 0xc0 ){
			pStream->zText++;
		}
		for(;;){
			zIn = pStream->zText;
			if( zIn[0] >= 0xc0 ){
				zIn++;
				/* UTF-8 stream */
				while( zIn < pStream->zEnd && ((zIn[0] & 0xc0) == 0x80) ){
					zIn++;
				}
			}
			/* Skip alphanumeric stream */
			while( zIn < pStream->zEnd && zIn[0] < 0xc0 && (SyisAlphaNum(zIn[0]) || zIn[0] == '_') ){
				zIn++;
			}
			if( zIn == pStream->zText ){
				/* Not an UTF-8 or alphanumeric stream */
				break;
			}
			/* Synchronize pointers */
			pStream->zText = zIn;
		}
		/* Record token length */
		pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
		/* A simple identifier */
		pToken->nType = JSON_TK_ID;
		if( pStr->nByte == sizeof("true") -1 && SyStrnicmp(pStr->zString, "true", sizeof("true")-1) == 0 ){
			/* boolean true */
			pToken->nType = JSON_TK_TRUE;
		}else if( pStr->nByte == sizeof("false") -1 && SyStrnicmp(pStr->zString,"false", sizeof("false")-1) == 0 ){
			/* boolean false */
			pToken->nType = JSON_TK_FALSE;
		}else if( pStr->nByte == sizeof("null") -1 && SyStrnicmp(pStr->zString,"null", sizeof("null")-1) == 0 ){
			/* NULL */
			pToken->nType = JSON_TK_NULL;
		}
		return SXRET_OK;
	}
	if( pStream->zText[0] == '{' || pStream->zText[0] == '[' || pStream->zText[0] == '}' || pStream->zText[0] == ']'
		|| pStream->zText[0] == ':' || pStream->zText[0] == ',' ){
			/* Single character */
			c = pStream->zText[0];
			/* Set token type */
			switch(c){
			case '[': pToken->nType = JSON_TK_OSB;   break;
			case '{': pToken->nType = JSON_TK_OCB;   break;
			case '}': pToken->nType = JSON_TK_CCB;   break;
			case ']': pToken->nType = JSON_TK_CSB;   break;
			case ':': pToken->nType = JSON_TK_COLON; break;
			case ',': pToken->nType = JSON_TK_COMMA; break;
			default:
				break;
			}
			/* Advance the stream cursor */
			pStream->zText++;
	}else if( pStream->zText[0] == '"') {
		/* JSON string */
		pStream->zText++;
		pStr->zString++;
		/* Delimit the string */
		while( pStream->zText < pStream->zEnd ){
			if( pStream->zText[0] == '"' && pStream->zText[-1] != '\\' ){
				break;
			}
			if( pStream->zText[0] == '\n' ){
				/* Update line counter */
				pStream->nLine++;
			}
			pStream->zText++;
		}
		if( pStream->zText >= pStream->zEnd ){
			/* Missing closing '"' */
			pToken->nType = JSON_TK_INVALID;
			*pJsonErr = SXERR_SYNTAX;
		}else{
			pToken->nType = JSON_TK_STR;
			pStream->zText++; /* Jump the closing double quotes */
		}
	}else if( (pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]))
	        || pStream->zText[0] == '-' || pStream->zText[0] == '+' ){
		/* Number */
		pStream->zText++;
		pToken->nType = JSON_TK_NUM;
		while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
			pStream->zText++;
		}
		if( pStream->zText < pStream->zEnd ){
			c = pStream->zText[0];
			if( c == '.' ){
					/* Real number */
					pStream->zText++;
					while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
						pStream->zText++;
					}
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c=='e' || c=='E' ){
							pStream->zText++;
							if( pStream->zText < pStream->zEnd ){
								c = pStream->zText[0];
								if( c =='+' || c=='-' ){
									pStream->zText++;
								}
								while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
									pStream->zText++;
								}
							}
						}
					}					
				}else if( c=='e' || c=='E' ){
					/* Real number */
					pStream->zText++;
					if( pStream->zText < pStream->zEnd ){
						c = pStream->zText[0];
						if( c =='+' || c=='-' ){
							pStream->zText++;
						}
						while( pStream->zText < pStream->zEnd && pStream->zText[0] < 0xc0 && SyisDigit(pStream->zText[0]) ){
							pStream->zText++;
						}
					}					
				}
			}
	}else{
		/* Unexpected token */
		pToken->nType = JSON_TK_INVALID;
		/* Advance the stream cursor */
		pStream->zText++;
		*pJsonErr = SXERR_SYNTAX;
		/* Abort processing immediatley */
		return SXERR_ABORT;
	}
	/* record token length */
	pStr->nByte = (sxu32)((const char *)pStream->zText-pStr->zString);
	if( pToken->nType == JSON_TK_STR ){
		pStr->nByte--;
	}
	/* Return to the lexer */
	return SXRET_OK;
}